

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentErrorsTest::ExpectError
          (RenderbufferAttachmentErrorsTest *this,GLenum expected_error,bool framebuffer,
          bool attachment,bool color_attachment,bool renderbuffertarget,bool renderbuffer)

{
  GLenum GVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  GLenum local_30;
  byte local_29;
  GLenum error;
  bool is_ok;
  Functions *gl;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  GLenum GStack_14;
  bool renderbuffer_local;
  bool renderbuffertarget_local;
  bool color_attachment_local;
  bool attachment_local;
  bool framebuffer_local;
  GLenum expected_error_local;
  RenderbufferAttachmentErrorsTest *this_local;
  
  gl._7_1_ = renderbuffer;
  local_18 = renderbuffertarget;
  local_17 = color_attachment;
  local_16 = attachment;
  local_15 = framebuffer;
  GStack_14 = expected_error;
  _renderbuffertarget_local = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  GVar1 = GStack_14;
  _error = CONCAT44(extraout_var,iVar2);
  local_29 = 1;
  local_30 = 0;
  local_30 = (**(code **)(_error + 0x800))();
  if (GVar1 != local_30) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [42])"NamedFramebufferRenderbuffer called with ");
    local_1c8[0] = "invalid";
    if ((local_15 & 1) != 0) {
      local_1c8[0] = "valid";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])" framebuffer, ");
    local_1d0 = "invalid";
    if ((local_16 & 1) != 0) {
      local_1d0 = "valid";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1d0);
    local_1d8 = "";
    if ((local_17 & 1) != 0) {
      local_1d8 = " color";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1d8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])" attachment, ");
    local_1e0 = "invalid";
    if ((local_18 & 1) != 0) {
      local_1e0 = "valid";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])" renderbuffer target, ");
    local_1e8 = "invalid";
    if ((gl._7_1_ & 1) != 0) {
      local_1e8 = "valid";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e8);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [40])" renderbuffer was expected to generate ");
    EVar5 = glu::getErrorStr(GStack_14);
    local_208 = EVar5.m_getName;
    local_200 = EVar5.m_value;
    local_1f8.m_getName = local_208;
    local_1f8.m_value = local_200;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2a6afaf);
    EVar5 = glu::getErrorStr(local_30);
    local_218.m_getName = EVar5.m_getName;
    local_218.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_218);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])" was observed instead.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    local_29 = 0;
  }
  do {
    iVar2 = (**(code **)(_error + 0x800))();
  } while (iVar2 != 0);
  return (bool)(local_29 & 1);
}

Assistant:

bool RenderbufferAttachmentErrorsTest::ExpectError(glw::GLenum expected_error, bool framebuffer, bool attachment,
												   bool color_attachment, bool renderbuffertarget, bool renderbuffer)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "NamedFramebufferRenderbuffer called with "
			<< (framebuffer ? "valid" : "invalid") << " framebuffer, " << (attachment ? "valid" : "invalid")
			<< (color_attachment ? " color" : "") << " attachment, " << (renderbuffertarget ? "valid" : "invalid")
			<< " renderbuffer target, " << (renderbuffer ? "valid" : "invalid")
			<< " renderbuffer was expected to generate " << glu::getErrorStr(expected_error) << ", but "
			<< glu::getErrorStr(error) << " was observed instead." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Clean additional possible errors. */
	while (gl.getError())
		;

	return is_ok;
}